

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_x_s12.c
# Opt level: O1

void gga_x_s12_init(xc_func_type *p)

{
  void *pvVar1;
  
  pvVar1 = malloc(0x30);
  p->params = pvVar1;
  *(undefined8 *)((long)pvVar1 + 0x28) = 0x3ff0000000000000;
  if (p->info->number == 0x1f0) {
    xc_hyb_init_hybrid(p,0.0);
    return;
  }
  return;
}

Assistant:

static void
gga_x_s12_init(xc_func_type *p)
{
  gga_x_s12_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(gga_x_s12_params));
  params = (gga_x_s12_params *) (p->params);

  params->bx  = 1.0; /* we initialize it here */

  if(p->info->number == XC_HYB_GGA_X_S12H)
    xc_hyb_init_hybrid(p, 0.0);
}